

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealights_ltc_file.cpp
# Opt level: O3

unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> __thiscall
alf::read_alf_file(alf *this,string *filename)

{
  FILE *__stream;
  undefined8 *puVar1;
  uint uVar2;
  alf_header header;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_48;
  int local_30;
  undefined4 uStack_2c;
  int iStack_28;
  int iStack_24;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (((__stream != (FILE *)0x0) && (fread(&local_30,0x10,1,__stream), local_30 == 0x464c41)) &&
     (uVar2 = iStack_28 * iStack_24, uVar2 != 0)) {
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize(&local_48,(ulong)(uVar2 * 4));
    fread(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start,0x10,(ulong)uVar2,__stream);
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize(&local_68,(ulong)(uVar2 * 3));
    fread(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start,0xc,(ulong)uVar2,__stream);
    fclose(__stream);
    puVar1 = (undefined8 *)operator_new(0x40);
    *(undefined8 **)this = puVar1;
    *puVar1 = CONCAT44(uStack_2c,local_30);
    puVar1[1] = CONCAT44(iStack_24,iStack_28);
    puVar1[2] = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
    puVar1[3] = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
    puVar1[4] = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    puVar1[5] = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
    puVar1[6] = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
    puVar1[7] = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
           (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)this;
  }
  *(undefined8 *)this = 0;
  return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
         (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)this;
}

Assistant:

std::unique_ptr<alf::alf_file> alf::read_alf_file(const std::string &filename)
{
  auto file = fopen(filename.c_str(), "rb");
  if (!file) {
    return nullptr;
  }

  alf::alf_header header;
  std::fread(&header, sizeof(alf::alf_header), 1, file);

  if (std::strcmp(header.id, "ALF") != 0) {
    return nullptr;
  }

  auto num_samples = header.num_samples_roughness * header.num_samples_angle;
  if (num_samples <= 0) {
    return nullptr;
  }

  std::vector<float> texture_slot1;
  texture_slot1.resize(4 * header.num_samples_angle * header.num_samples_roughness);
  std::fread(&texture_slot1[0], sizeof(float)*4, num_samples, file);

  std::vector<float> texture_slot2;
  texture_slot2.resize(3 * header.num_samples_angle * header.num_samples_roughness);
  std::fread(&texture_slot2[0], sizeof(float)*3, num_samples, file);

  std::fclose(file);

  auto alf_file = std::make_unique<alf::alf_file>();
  alf_file->header = std::move(header);
  alf_file->texture_slot1 = std::move(texture_slot1);
  alf_file->texture_slot2 = std::move(texture_slot2);
  return alf_file;
}